

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QEmbedableButton_p.h
# Opt level: O2

void __thiscall QEmbedableButton::~QEmbedableButton(QEmbedableButton *this)

{
  QToolButton::~QToolButton((QToolButton *)&this[-1].field_0x20);
  return;
}

Assistant:

class QT_WIDGETS_EXTRA_QT_WIDGETS_EXTRA_LIB_EXPORT QEmbedableButton : public QToolButton {
    Q_OBJECT

public:
    explicit QEmbedableButton(QWidget *parent = nullptr);

    bool isEmbeded() const;
    void setEmbeded(bool embed);

protected:
    void paintEvent(QPaintEvent *event) override;

private:
    bool embeded;
}